

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void pcache1Rekey(sqlite3_pcache *p,sqlite3_pcache_page *pPg,uint iOld,uint iNew)

{
  uint uVar1;
  uint hNew;
  uint hOld;
  PgHdr1 **pp;
  PgHdr1 *pPage;
  PCache1 *pCache;
  uint iNew_local;
  uint iOld_local;
  sqlite3_pcache_page *pPg_local;
  sqlite3_pcache *p_local;
  
  for (pp = (PgHdr1 **)(*(long *)(p + 0x40) + (ulong)(iOld % *(uint *)(p + 0x3c)) * 8);
      *pp != (PgHdr1 *)pPg; pp = &(*pp)->pNext) {
  }
  *pp = (PgHdr1 *)pPg[1].pExtra;
  uVar1 = *(uint *)(p + 0x3c);
  *(uint *)&pPg[1].pBuf = iNew;
  pPg[1].pExtra = *(void **)(*(long *)(p + 0x40) + (ulong)(iNew % uVar1) * 8);
  *(sqlite3_pcache_page **)(*(long *)(p + 0x40) + (ulong)(iNew % uVar1) * 8) = pPg;
  if (*(uint *)(p + 0x2c) < iNew) {
    *(uint *)(p + 0x2c) = iNew;
  }
  return;
}

Assistant:

static void pcache1Rekey(
  sqlite3_pcache *p,
  sqlite3_pcache_page *pPg,
  unsigned int iOld,
  unsigned int iNew
){
  PCache1 *pCache = (PCache1 *)p;
  PgHdr1 *pPage = (PgHdr1 *)pPg;
  PgHdr1 **pp;
  unsigned int hOld, hNew;
  assert( pPage->iKey==iOld );
  assert( pPage->pCache==pCache );
  assert( iOld!=iNew );               /* The page number really is changing */

  pcache1EnterMutex(pCache->pGroup);

  assert( pcache1FetchNoMutex(p, iOld, 0)==pPage ); /* pPg really is iOld */
  hOld = iOld%pCache->nHash;
  pp = &pCache->apHash[hOld];
  while( (*pp)!=pPage ){
    pp = &(*pp)->pNext;
  }
  *pp = pPage->pNext;

  assert( pcache1FetchNoMutex(p, iNew, 0)==0 ); /* iNew not in cache */
  hNew = iNew%pCache->nHash;
  pPage->iKey = iNew;
  pPage->pNext = pCache->apHash[hNew];
  pCache->apHash[hNew] = pPage;
  if( iNew>pCache->iMaxKey ){
    pCache->iMaxKey = iNew;
  }

  pcache1LeaveMutex(pCache->pGroup);
}